

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPExternalTransmitter::SetReceiveMode(RTPExternalTransmitter *this,ReceiveMode m)

{
  int iVar1;
  
  iVar1 = -0x97;
  if (((this->init == true) && (iVar1 = -0x96, this->created == true)) &&
     (iVar1 = -0x8e, m == AcceptAll)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPExternalTransmitter::SetReceiveMode(RTPTransmitter::ReceiveMode m)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (m != RTPTransmitter::AcceptAll)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_BADRECEIVEMODE;
	}
	MAINMUTEX_UNLOCK
	return 0;
}